

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar6 = (int)CONCAT62(in_register_0000003a,op);
  uVar5 = iVar6 - 0x11f;
  if (uVar5 < 0x2e) {
    reader = (ByteCodeReader *)0x3cc800000000;
    if ((0x3cc800000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      reader = (ByteCodeReader *)0x28200003;
      if ((0x28200003UL >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_0075161a;
      goto LAB_007515ff;
    }
  }
  else {
LAB_0075161a:
    if (iVar6 - 0xd6U < 3) {
      this = ParseableFunctionInfo::GetNestedFunctionProxy
                       (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
      uVar1 = data->Value;
      pPVar7 = FunctionProxy::EnsureDeserialized(this);
      iVar6 = (*(pPVar7->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pPVar7);
      Output::Print(L" R%d = %s()",(ulong)uVar1,CONCAT44(extraout_var,iVar6));
      return;
    }
    if (iVar6 == 0x92) {
LAB_007515ff:
      uVar1 = data->Value;
      uVar2 = data->SlotIndex;
      form = L" R%d = [%d] ";
      goto LAB_0075160d;
    }
    if (iVar6 != 0x96) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x395,"(false)","Unknown OpCode for OpLayoutElementSlotI1");
      if (bVar4) {
        *puVar8 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  uVar1 = data->SlotIndex;
  uVar2 = data->Value;
  form = L" [%d] = R%d ";
LAB_0075160d:
  Output::Print(form,(ulong)uVar1,(ulong)uVar2,reader);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI1(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StLocalSlot:
            case OpCode::StParamSlot:
            case OpCode::StLocalObjSlot:
            case OpCode::StParamObjSlot:
            case OpCode::StLocalSlotChkUndecl:
            case OpCode::StParamSlotChkUndecl:
            case OpCode::StLocalObjSlotChkUndecl:
            case OpCode::StParamObjSlotChkUndecl:
                Output::Print(_u(" [%d] = R%d "),data->SlotIndex, data->Value);
                break;
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdEnvObj:
            case OpCode::LdEnvObj_ReuseLoc:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                Output::Print(_u(" R%d = [%d] "), data->Value, data->SlotIndex);
                break;
            case OpCode::NewScFunc:
            case OpCode::NewStackScFunc:
            case OpCode::NewScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = %s()"), data->Value,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI1");
                break;
            }
        }
    }